

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sstream.cpp
# Opt level: O1

void __thiscall string_stream_to_string_Test::TestBody(string_stream_to_string_Test *this)

{
  char *pcVar1;
  AssertionResult gtest_ar;
  AssertionResult gtest_ar_1;
  char latin1 [5];
  string_stream ss2;
  string_stream ss;
  string local_290;
  undefined1 local_270 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_268;
  internal local_250 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_248;
  char local_240 [8];
  string_stream local_238;
  string_stream local_120;
  
  local_240[4] = 0;
  local_240[0] = ' ';
  local_240[1] = '~';
  local_240[2] = -0x60;
  local_240[3] = -1;
  local_120.m_chars = local_120.m_stack;
  local_120.m_alloc = 0x100;
  local_120.m_size = 0;
  ST::string_stream::append(&local_120,local_240,0xffffffffffffffff);
  ST::string::from_latin_1((string *)&local_238,local_240,0xffffffffffffffff);
  ST::string::from_latin_1(&local_290,local_120.m_chars,local_120.m_size);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            ((internal *)local_270,"ST::string::from_latin_1(latin1)","ss.to_string(false)",
             (string *)&local_238,&local_290);
  if ((0xf < local_290.m_buffer.m_size) && ((long *)local_290.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_290.m_buffer.m_chars);
  }
  if ((0xf < local_238.m_alloc) && ((long *)local_238.m_chars != (long *)0x0)) {
    operator_delete__(local_238.m_chars);
  }
  if (local_270[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_238);
    if (local_268 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_268->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_290,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x91,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_290,(Message *)&local_238);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_290);
    if ((long *)local_238.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_238.m_chars + 8))();
    }
  }
  if (local_268 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_268,local_268);
  }
  local_238.m_chars = local_238.m_stack;
  local_238.m_alloc = 0x100;
  local_238.m_size = 0;
  ST::string_stream::append(&local_238,TestBody::utf8_test_data,0xffffffffffffffff);
  ST::string::from_utf8(&local_290,TestBody::utf8_test_data,0xffffffffffffffff,check_validity);
  ST::string::from_utf8((string *)local_270,local_238.m_chars,local_238.m_size,check_validity);
  testing::internal::CmpHelperEQ<ST::string,ST::string>
            (local_250,"ST::string::from_utf8(utf8_test_data)","ss2.to_string(true)",&local_290,
             (string *)local_270);
  if (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_0000000f <
       local_268) && ((void *)CONCAT71(local_270._1_7_,local_270[0]) != (void *)0x0)) {
    operator_delete__((void *)CONCAT71(local_270._1_7_,local_270[0]));
  }
  if ((0xf < local_290.m_buffer.m_size) && ((long *)local_290.m_buffer.m_chars != (long *)0x0)) {
    operator_delete__(local_290.m_buffer.m_chars);
  }
  if (local_250[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_290);
    if (local_248 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar1 = "";
    }
    else {
      pcVar1 = (local_248->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_270,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_sstream.cpp"
               ,0x95,pcVar1);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_270,(Message *)&local_290);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_270);
    if ((long *)local_290.m_buffer.m_chars != (long *)0x0) {
      (**(code **)(*(long *)local_290.m_buffer.m_chars + 8))();
    }
  }
  if (local_248 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_248,local_248);
  }
  if ((0x100 < local_238.m_alloc) && (local_238.m_chars != (char *)0x0)) {
    operator_delete__(local_238.m_chars);
  }
  if ((0x100 < local_120.m_alloc) && (local_120.m_chars != (char *)0x0)) {
    operator_delete__(local_120.m_chars);
  }
  return;
}

Assistant:

TEST(string_stream, to_string)
{
    const char latin1[] = "\x20\x7e\xa0\xff";
    static const char utf8_test_data[] =
        "\x20"              "\x7f"
        "\xc3\xbf"          "\xc4\x80"
        "\xe7\xbf\xbf"
        "\xef\xbf\xbf"      "\xf0\x90\x80\x80"
        "\xf0\x90\x80\xa0"  "\xf1\x80\x80\x80"
        "\xf4\x8f\xbf\xbf";

    ST::string_stream ss;
    ss.append(latin1);
    EXPECT_EQ(ST::string::from_latin_1(latin1), ss.to_string(false));

    ST::string_stream ss2;
    ss2.append(utf8_test_data);
    EXPECT_EQ(ST::string::from_utf8(utf8_test_data), ss2.to_string(true));
}